

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

char * ps_lookup_word(ps_decoder_t *ps,char *word)

{
  dict_t *d;
  s3wid_t wid;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  uint uVar4;
  ulong elem_size;
  int32 pos;
  int pos_00;
  
  d = ps->dict;
  wid = dict_wordid(d,word);
  if (wid == -1) {
    pcVar2 = (char *)0x0;
  }
  else {
    elem_size = 0;
    if (0 < d->word[wid].pronlen) {
      pos = 0;
      do {
        pcVar2 = dict_ciphone_str(d,wid,pos);
        sVar3 = strlen(pcVar2);
        uVar4 = (int)elem_size + (int)sVar3 + 1;
        elem_size = (ulong)uVar4;
        pos = pos + 1;
      } while (pos < d->word[wid].pronlen);
      elem_size = (ulong)(int)uVar4;
    }
    pcVar2 = (char *)__ckd_calloc__(1,elem_size,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                    ,0x3fd);
    if (0 < d->word[wid].pronlen) {
      pos_00 = 0;
      do {
        __src = dict_ciphone_str(d,wid,pos_00);
        strcat(pcVar2,__src);
        iVar1 = d->word[wid].pronlen;
        if (pos_00 != iVar1 + -1) {
          sVar3 = strlen(pcVar2);
          (pcVar2 + sVar3)[0] = ' ';
          (pcVar2 + sVar3)[1] = '\0';
          iVar1 = d->word[wid].pronlen;
        }
        pos_00 = pos_00 + 1;
      } while (pos_00 < iVar1);
    }
  }
  return pcVar2;
}

Assistant:

char *
ps_lookup_word(ps_decoder_t *ps, const char *word)
{
    s3wid_t wid;
    int32 phlen, j;
    char *phones;
    dict_t *dict = ps->dict;
    
    wid = dict_wordid(dict, word);
    if (wid == BAD_S3WID)
	return NULL;

    for (phlen = j = 0; j < dict_pronlen(dict, wid); ++j)
        phlen += strlen(dict_ciphone_str(dict, wid, j)) + 1;
    phones = ckd_calloc(1, phlen);
    for (j = 0; j < dict_pronlen(dict, wid); ++j) {
        strcat(phones, dict_ciphone_str(dict, wid, j));
        if (j != dict_pronlen(dict, wid) - 1)
            strcat(phones, " ");
    }
    return phones;
}